

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O2

Number * __thiscall LiteScript::Number::operator=(Number *this,Number *number)

{
  this->numeric_type = number->numeric_type;
  this->value = number->value;
  return this;
}

Assistant:

LiteScript::Number& LiteScript::Number::operator=(const LiteScript::Number& number) {
    this->numeric_type = number.numeric_type;
    if (this->numeric_type == 0)
        this->value.integer = number.value.integer;
    else
        this->value.flotting = number.value.flotting;
    return *this;
}